

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv6transmitter.cpp
# Opt level: O0

int __thiscall
jrtplib::RTPUDPv6Transmitter::LeaveMulticastGroup(RTPUDPv6Transmitter *this,RTPAddress *addr)

{
  AddressType AVar1;
  undefined8 local_68;
  ipv6_mreq mreq_1;
  ipv6_mreq mreq;
  in6_addr mcastIP;
  RTPIPv6Address *address;
  int status;
  RTPAddress *addr_local;
  RTPUDPv6Transmitter *this_local;
  
  if ((this->init & 1U) == 0) {
    this_local._4_4_ = -0x72;
  }
  else if ((this->created & 1U) == 0) {
    this_local._4_4_ = -0x71;
  }
  else {
    AVar1 = RTPAddress::GetAddressType(addr);
    if (AVar1 == IPv6Address) {
      join_0x00000010_0x00000000_ =
           (anon_union_16_3_a3f0114d_for___in6_u)RTPIPv6Address::GetIP((RTPIPv6Address *)addr);
      if (mreq.ipv6mr_multiaddr.__in6_u.__u6_addr8[0xc] == 0xff) {
        address._4_4_ =
             RTPHashTable<const_in6_addr,_jrtplib::RTPUDPv6Trans_GetHashIndex_in6_addr,_8317>::
             DeleteElement(&this->multicastgroups,
                           (in6_addr *)((long)&mreq.ipv6mr_multiaddr.__in6_u + 0xc));
        if (-1 < address._4_4_) {
          mreq_1._12_8_ = mreq._12_8_;
          mreq.ipv6mr_multiaddr.__in6_u._0_8_ = mcastIP.__in6_u._0_8_;
          mreq.ipv6mr_multiaddr.__in6_u.__u6_addr32[2] = this->mcastifidx;
          setsockopt(this->rtpsock,0x29,0x15,(void *)((long)&mreq_1.ipv6mr_multiaddr.__in6_u + 0xc),
                     0x14);
          local_68 = mreq._12_8_;
          mreq_1.ipv6mr_multiaddr.__in6_u._0_8_ = mcastIP.__in6_u._0_8_;
          mreq_1.ipv6mr_multiaddr.__in6_u.__u6_addr32[2] = this->mcastifidx;
          setsockopt(this->rtcpsock,0x29,0x15,&local_68,0x14);
          address._4_4_ = 0;
        }
        this_local._4_4_ = address._4_4_;
      }
      else {
        this_local._4_4_ = -0x70;
      }
    }
    else {
      this_local._4_4_ = -0x6c;
    }
  }
  return this_local._4_4_;
}

Assistant:

int RTPUDPv6Transmitter::LeaveMulticastGroup(const RTPAddress &addr)
{
	if (!init)
		return ERR_RTP_UDPV6TRANS_NOTINIT;

	MAINMUTEX_LOCK
	
	int status;
	
	if (!created)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV6TRANS_NOTCREATED;
	}
	if (addr.GetAddressType() != RTPAddress::IPv6Address)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV6TRANS_INVALIDADDRESSTYPE;
	}
	
	const RTPIPv6Address &address = (const RTPIPv6Address &)addr;
	in6_addr mcastIP = address.GetIP();
	
	if (!RTPUDPV6TRANS_IS_MCASTADDR(mcastIP))
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV6TRANS_NOTAMULTICASTADDRESS;
	}
	
	status = multicastgroups.DeleteElement(mcastIP);
	if (status >= 0)
	{	
		RTPUDPV6TRANS_MCASTMEMBERSHIP(rtpsock,IPV6_LEAVE_GROUP,mcastIP,status);
		RTPUDPV6TRANS_MCASTMEMBERSHIP(rtcpsock,IPV6_LEAVE_GROUP,mcastIP,status);
		status = 0;
	}
	
	MAINMUTEX_UNLOCK
	return status;
}